

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

void stbtt_MakeGlyphBitmapSubpixelPrefilter
               (stbtt_fontinfo *info,uchar *output,int out_w,int out_h,int out_stride,float scale_x,
               float scale_y,float shift_x,float shift_y,int prefilter_x,int prefilter_y,
               float *sub_x,float *sub_y,int glyph)

{
  float fVar1;
  int prefilter_x_local;
  float shift_y_local;
  float shift_x_local;
  float scale_y_local;
  float scale_x_local;
  int out_stride_local;
  int out_h_local;
  int out_w_local;
  uchar *output_local;
  stbtt_fontinfo *info_local;
  
  stbtt_MakeGlyphBitmapSubpixel
            (info,output,out_w - (prefilter_x + -1),out_h - (prefilter_y + -1),out_stride,scale_x,
             scale_y,shift_x,shift_y,glyph);
  if (1 < prefilter_x) {
    stbtt__h_prefilter(output,out_w,out_h,out_stride,prefilter_x);
  }
  if (1 < prefilter_y) {
    stbtt__v_prefilter(output,out_w,out_h,out_stride,prefilter_y);
  }
  fVar1 = stbtt__oversample_shift(prefilter_x);
  *sub_x = fVar1;
  fVar1 = stbtt__oversample_shift(prefilter_y);
  *sub_y = fVar1;
  return;
}

Assistant:

STBTT_DEF void stbtt_MakeGlyphBitmapSubpixelPrefilter(const stbtt_fontinfo *info, unsigned char *output, int out_w, int out_h, int out_stride, float scale_x, float scale_y, float shift_x, float shift_y, int prefilter_x, int prefilter_y, float *sub_x, float *sub_y, int glyph)
{
   stbtt_MakeGlyphBitmapSubpixel(info,
                                 output,
                                 out_w - (prefilter_x - 1),
                                 out_h - (prefilter_y - 1),
                                 out_stride,
                                 scale_x,
                                 scale_y,
                                 shift_x,
                                 shift_y,
                                 glyph);

   if (prefilter_x > 1)
      stbtt__h_prefilter(output, out_w, out_h, out_stride, prefilter_x);

   if (prefilter_y > 1)
      stbtt__v_prefilter(output, out_w, out_h, out_stride, prefilter_y);

   *sub_x = stbtt__oversample_shift(prefilter_x);
   *sub_y = stbtt__oversample_shift(prefilter_y);
}